

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

Enum xatlas::AddMesh(Atlas *atlas,MeshDecl *meshDecl,uint32_t meshCountHint)

{
  Array<xatlas::internal::Vector3> *this;
  float epsilon;
  uint uVar1;
  uint32_t uVar2;
  void *pvVar3;
  uint uVar4;
  undefined1 auVar5 [12];
  uint32_t v2;
  Array<xatlas::internal::Vector2> *this_00;
  bool bVar6;
  uint32_t uVar7;
  TaskGroupHandle TVar8;
  Progress *this_01;
  Mesh *this_02;
  Vector3 *pVVar9;
  Vector3 *pVVar10;
  Vector2 *pVVar11;
  Vector3 *a;
  undefined8 *puVar12;
  char *in_RCX;
  int iVar13;
  int extraout_EDX;
  ulong extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar15;
  undefined8 extraout_RDX_02;
  int j;
  long lVar16;
  uint uVar17;
  char *pcVar18;
  int in_R8D;
  int iVar19;
  undefined *puVar20;
  uint32_t i;
  ulong uVar21;
  Enum EVar22;
  long lVar23;
  float fVar24;
  Vector3 VVar25;
  Task task;
  bool local_ac;
  uint32_t tri [3];
  Vector3 local_68;
  Vector3 local_58;
  Array<xatlas::internal::Vector2> *local_48;
  ulong local_40;
  long local_38;
  ulong uVar14;
  
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x220b,"AddMeshError::Enum xatlas::AddMesh(Atlas *, const MeshDecl &, uint32_t)")
    ;
  }
  if (*(int *)&atlas[4].field_0x14 == 0) {
    if (*(Progress **)&atlas[1].atlasCount == (Progress *)0x0) {
      this_01 = (Progress *)internal::Realloc((void *)0x0,0x50,meshCountHint,in_RCX,in_R8D);
      internal::Progress::Progress
                (this_01,AddMesh,*(ProgressFunc *)&atlas[3].texelsPerUnit,atlas[3].image,1);
      *(Progress **)&atlas[1].atlasCount = this_01;
    }
    else {
      uVar17 = atlas[1].width + 1;
      if (uVar17 <= meshCountHint) {
        uVar17 = meshCountHint;
      }
      internal::Progress::setMaxValue(*(Progress **)&atlas[1].atlasCount,uVar17);
    }
    uVar17 = meshDecl->vertexCount;
    pcVar18 = (char *)(ulong)uVar17;
    uVar1 = meshDecl->indexCount;
    uVar4 = uVar1;
    if (uVar1 == 0) {
      uVar4 = uVar17;
    }
    EVar22 = InvalidIndexCount;
    puVar20 = internal::s_print;
    if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
      pcVar18 = (char *)((ulong)uVar4 / 3);
      (*(code *)internal::s_print)
                ("Adding mesh %d: %u vertices, %u triangles\n",atlas[1].width,uVar17);
    }
    iVar19 = (int)puVar20;
    uVar14 = (ulong)uVar4 % 3;
    if ((int)uVar14 == 0) {
      iVar13 = 0;
      if (uVar1 == 0) {
LAB_00194928:
        uVar17 = (uint)(meshDecl->vertexNormalData != (void *)0x0) * 4 + 3;
        this_02 = (Mesh *)internal::Realloc((void *)0x0,0x1c0,iVar13,pcVar18,iVar19);
        uVar14 = (ulong)atlas[1].width;
        pVVar9 = (Vector3 *)(ulong)uVar17;
        internal::Mesh::Mesh
                  (this_02,meshDecl->epsilon,meshDecl->vertexCount,uVar4 / 3,uVar17,atlas[1].width);
        uVar15 = extraout_RDX_00;
        for (uVar17 = 0; uVar17 < meshDecl->vertexCount; uVar17 = uVar17 + 1) {
          tri[0] = 0;
          tri[1] = 0;
          tri[2] = 0;
          fVar24 = local_68.z;
          auVar5._4_8_ = 0;
          auVar5._0_4_ = local_68.z;
          local_68 = (Vector3)(auVar5 << 0x40);
          pvVar3 = meshDecl->vertexNormalData;
          if (pvVar3 != (void *)0x0) {
            if (meshDecl->vertexNormalStride == 0) {
              __assert_fail("meshDecl.vertexNormalStride > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x21f6,
                            "internal::Vector3 xatlas::DecodeNormal(const MeshDecl &, uint32_t)");
            }
            uVar21 = (ulong)(meshDecl->vertexNormalStride * uVar17);
            tri._0_8_ = *(undefined8 *)((long)pvVar3 + uVar21);
            tri[2] = *(uint32_t *)((long)pvVar3 + uVar21 + 8);
          }
          if (meshDecl->vertexUvData != (void *)0x0) {
            if (meshDecl->vertexUvStride == 0) {
              __assert_fail("meshDecl.vertexUvStride > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x21fd,"internal::Vector2 xatlas::DecodeUv(const MeshDecl &, uint32_t)"
                           );
            }
            local_68._0_8_ =
                 *(undefined8 *)
                  ((long)meshDecl->vertexUvData + (ulong)(meshDecl->vertexUvStride * uVar17));
            local_68 = (Vector3)CONCAT48(fVar24,local_68._0_8_);
          }
          pvVar3 = meshDecl->vertexPositionData;
          if (pvVar3 == (void *)0x0) {
            __assert_fail("meshDecl.vertexPositionData",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x21ee,
                          "internal::Vector3 xatlas::DecodePosition(const MeshDecl &, uint32_t)");
          }
          if (meshDecl->vertexPositionStride == 0) {
            __assert_fail("meshDecl.vertexPositionStride > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x21ef,
                          "internal::Vector3 xatlas::DecodePosition(const MeshDecl &, uint32_t)");
          }
          uVar21 = (ulong)(meshDecl->vertexPositionStride * uVar17);
          local_58.z = *(float *)((long)pvVar3 + uVar21 + 8);
          local_58._0_8_ = *(undefined8 *)((long)pvVar3 + uVar21);
          pVVar9 = &local_68;
          internal::Mesh::addVertex(this_02,&local_58,(Vector3 *)tri,(Vector2 *)&local_68);
          uVar15 = extraout_RDX_01;
        }
        this = &this_02->m_positions;
        local_48 = &this_02->m_texcoords;
        local_40 = (ulong)(uVar4 / 3);
        lVar23 = 0;
        uVar21 = 0;
LAB_00194a62:
        iVar13 = (int)uVar14;
        iVar19 = (int)uVar15;
        if (uVar21 != local_40) {
          for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
            if (uVar1 == 0) {
              uVar7 = (int)lVar23 + (int)lVar16;
            }
            else {
              uVar7 = DecodeIndex(meshDecl->indexFormat,meshDecl->indexData,meshDecl->indexOffset,
                                  (int)lVar23 + (int)lVar16);
            }
            tri[lVar16] = uVar7;
          }
          lVar16 = 0;
          local_38 = lVar23;
          do {
            this_00 = local_48;
            if (lVar16 == 3) {
              lVar23 = 0;
              goto LAB_00194b91;
            }
            uVar7 = tri[lVar16];
            lVar23 = 0;
            if (lVar16 != 2) {
              lVar23 = lVar16 + 1;
            }
            uVar2 = tri[lVar23];
            if (uVar7 == uVar2) {
              if (internal::s_print == (undefined *)0x0) goto LAB_00194d01;
              local_ac = true;
              if (internal::s_printVerbose == '\x01') {
                (*(code *)internal::s_print)("   Degenerate edge: index %d, index %d\n",uVar7,uVar7)
                ;
              }
              goto LAB_00194d07;
            }
            pVVar9 = internal::Array<xatlas::internal::Vector3>::operator[](this,uVar7);
            pVVar10 = internal::Array<xatlas::internal::Vector3>::operator[](this,uVar2);
            VVar25 = internal::operator-(pVVar10,pVVar9);
            lVar16 = lVar16 + 1;
          } while (0.0 < SQRT(VVar25.z * VVar25.z + VVar25.x * VVar25.x + VVar25.y * VVar25.y));
          if (internal::s_print == (undefined *)0x0) {
LAB_00194d01:
            local_ac = true;
          }
          else {
            local_ac = true;
            if (internal::s_printVerbose == '\x01') {
              (*(code *)internal::s_print)
                        ((double)pVVar9->x,(double)pVVar9->y,(double)pVVar9->z,(double)pVVar10->x,
                         (double)pVVar10->y,(double)pVVar10->z,
                         "   Zero length edge: index %d position (%g %g %g), index %d position (%g %g %g)\n"
                         ,uVar7,uVar2);
            }
          }
          goto LAB_00194d07;
        }
        if (atlas[1].meshCount == 0xffffffff) {
          TVar8 = internal::TaskScheduler::createTaskGroup(*(TaskScheduler **)(atlas + 4),0);
          atlas[1].meshCount = TVar8.value;
          iVar19 = extraout_EDX;
        }
        EVar22 = Success;
        puVar12 = (undefined8 *)internal::Realloc((void *)0x0,0x10,iVar19,(char *)pVVar9,iVar13);
        *puVar12 = atlas;
        puVar12[1] = this_02;
        task.userData = puVar12;
        task.func = runAddMeshTask;
        internal::TaskScheduler::run
                  (*(TaskScheduler **)(atlas + 4),(TaskGroupHandle)atlas[1].meshCount,task);
        atlas[1].width = atlas[1].width + 1;
      }
      else {
        uVar17 = 0;
        EVar22 = IndexOutOfRange;
        do {
          iVar19 = (int)puVar20;
          iVar13 = (int)uVar14;
          if (uVar4 == uVar17) goto LAB_00194928;
          pcVar18 = (char *)(ulong)uVar17;
          uVar7 = DecodeIndex(meshDecl->indexFormat,meshDecl->indexData,meshDecl->indexOffset,uVar17
                             );
          uVar17 = uVar17 + 1;
          uVar14 = extraout_RDX;
        } while (uVar7 < meshDecl->vertexCount);
      }
    }
  }
  else {
    EVar22 = Error;
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
  }
  return EVar22;
LAB_00194b91:
  if (lVar23 == 3) goto LAB_00194c7a;
  uVar7 = tri[lVar23];
  pVVar9 = internal::Array<xatlas::internal::Vector3>::operator[](this,uVar7);
  if (((NAN(pVVar9->x)) || (NAN(pVVar9->y))) || (NAN(pVVar9->z))) {
    if (internal::s_print == (undefined *)0x0) goto LAB_00194d01;
    local_ac = true;
    if (internal::s_printVerbose == '\x01') {
      pcVar18 = "   NAN position in face: %d\n";
LAB_00194cfb:
      local_ac = true;
      (*(code *)internal::s_print)(pcVar18,uVar21);
    }
    goto LAB_00194d07;
  }
  if ((meshDecl->vertexNormalData != (void *)0x0) &&
     (((pVVar9 = internal::Mesh::normal(this_02,uVar7), NAN(pVVar9->x) || (NAN(pVVar9->y))) ||
      (NAN(pVVar9->z))))) {
    if (internal::s_print == (undefined *)0x0) goto LAB_00194d01;
    local_ac = true;
    if (internal::s_printVerbose == '\x01') {
      pcVar18 = "   NAN normal in face: %d\n";
      goto LAB_00194cfb;
    }
    goto LAB_00194d07;
  }
  if ((meshDecl->vertexUvData != (void *)0x0) &&
     ((pVVar11 = internal::Array<xatlas::internal::Vector2>::operator[](this_00,uVar7),
      NAN(pVVar11->x) || (NAN(pVVar11->y))))) {
    if (internal::s_print == (undefined *)0x0) goto LAB_00194d01;
    local_ac = true;
    if (internal::s_printVerbose == '\x01') {
      pcVar18 = "   NAN texture coordinate in face: %d\n";
      goto LAB_00194cfb;
    }
    goto LAB_00194d07;
  }
  lVar23 = lVar23 + 1;
  goto LAB_00194b91;
LAB_00194c7a:
  local_ac = false;
LAB_00194d07:
  uVar15 = tri._0_8_;
  uVar7 = tri[0];
  pVVar9 = internal::Array<xatlas::internal::Vector3>::operator[](this,tri[0]);
  uVar2 = tri[1];
  pVVar10 = internal::Array<xatlas::internal::Vector3>::operator[](this,tri[1]);
  v2 = tri[2];
  a = internal::Array<xatlas::internal::Vector3>::operator[](this,tri[2]);
  if (local_ac == false) {
    local_58 = internal::operator-(pVVar10,pVVar9);
    local_68 = internal::operator-(a,pVVar9);
    VVar25 = internal::cross(&local_58,&local_68);
    fVar24 = SQRT(VVar25.z * VVar25.z + VVar25.x * VVar25.x + VVar25.y * VVar25.y) * 0.5;
    if (fVar24 <= 1.1920929e-07) {
      local_ac = true;
      if ((internal::s_print == (undefined *)0x0) || (internal::s_printVerbose != '\x01'))
      goto LAB_00194e84;
      (*(code *)internal::s_print)
                ((double)fVar24,"   Zero area face: %d, indices (%d %d %d), area is %f\n",
                 uVar21 & 0xffffffff,uVar15 & 0xffffffff,uVar2,v2);
    }
    else {
      epsilon = meshDecl->epsilon;
      bVar6 = internal::equal(pVVar9,pVVar10,epsilon);
      if ((((!bVar6) && (bVar6 = internal::equal(pVVar9,a,epsilon), !bVar6)) &&
          (bVar6 = internal::equal(pVVar10,a,epsilon), !bVar6)) ||
         ((local_ac = true, internal::s_print == (undefined *)0x0 ||
          (internal::s_printVerbose != '\x01')))) goto LAB_00194e84;
      (*(code *)internal::s_print)
                ((double)fVar24,"   Degenerate face: %d, area is %f\n",uVar21 & 0xffffffff);
    }
    local_ac = true;
  }
LAB_00194e84:
  if ((meshDecl->faceIgnoreData != (bool *)0x0) && (meshDecl->faceIgnoreData[uVar21] != false)) {
    local_ac = true;
  }
  uVar14 = (ulong)local_ac;
  pVVar9 = (Vector3 *)(ulong)v2;
  internal::Mesh::addFace(this_02,uVar7,uVar2,v2,local_ac,true);
  uVar21 = uVar21 + 1;
  lVar23 = local_38 + 3;
  uVar15 = extraout_RDX_02;
  goto LAB_00194a62;
}

Assistant:

AddMeshError::Enum AddMesh(Atlas *atlas, const MeshDecl &meshDecl, uint32_t meshCountHint)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (!ctx->uvMeshes.isEmpty()) {
		XA_PRINT_WARNING("AddMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
#if XA_PROFILE
	if (ctx->meshCount == 0)
		internal::s_profile.addMeshReal = clock();
#endif
	// Don't know how many times AddMesh will be called, so progress needs to adjusted each time.
	if (!ctx->addMeshProgress) {
		ctx->addMeshProgress = XA_NEW_ARGS(internal::MemTag::Default, internal::Progress, ProgressCategory::AddMesh, ctx->progressFunc, ctx->progressUserData, 1);
	}
	else {
		ctx->addMeshProgress->setMaxValue(internal::max(ctx->meshCount + 1, meshCountHint));
	}
	XA_PROFILE_START(addMeshCopyData)
	const bool hasIndices = meshDecl.indexCount > 0;
	const uint32_t indexCount = hasIndices ? meshDecl.indexCount : meshDecl.vertexCount;
	XA_PRINT("Adding mesh %d: %u vertices, %u triangles\n", ctx->meshCount, meshDecl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (hasIndices) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(meshDecl.indexFormat, meshDecl.indexData, meshDecl.indexOffset, i);
			if (index >= meshDecl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	uint32_t meshFlags = internal::MeshFlags::HasFaceGroups | internal::MeshFlags::HasIgnoredFaces;
	if (meshDecl.vertexNormalData)
		meshFlags |= internal::MeshFlags::HasNormals;
	internal::Mesh *mesh = XA_NEW_ARGS(internal::MemTag::Mesh, internal::Mesh, meshDecl.epsilon, meshDecl.vertexCount, indexCount / 3, meshFlags, ctx->meshCount);
	for (uint32_t i = 0; i < meshDecl.vertexCount; i++) {
		internal::Vector3 normal(0.0f);
		internal::Vector2 texcoord(0.0f);
		if (meshDecl.vertexNormalData)
			normal = DecodeNormal(meshDecl, i);
		if (meshDecl.vertexUvData)
			texcoord = DecodeUv(meshDecl, i);
		mesh->addVertex(DecodePosition(meshDecl, i), normal, texcoord);
	}
	for (uint32_t i = 0; i < indexCount / 3; i++) {
		uint32_t tri[3];
		for (int j = 0; j < 3; j++)
			tri[j] = hasIndices ? DecodeIndex(meshDecl.indexFormat, meshDecl.indexData, meshDecl.indexOffset, i * 3 + j) : i * 3 + j;
		bool ignore = false;
		// Check for degenerate or zero length edges.
		for (int j = 0; j < 3; j++) {
			const uint32_t index1 = tri[j];
			const uint32_t index2 = tri[(j + 1) % 3];
			if (index1 == index2) {
				ignore = true;
				XA_PRINT("   Degenerate edge: index %d, index %d\n", index1, index2);
				break;
			}
			const internal::Vector3 &pos1 = mesh->position(index1);
			const internal::Vector3 &pos2 = mesh->position(index2);
			if (internal::length(pos2 - pos1) <= 0.0f) {
				ignore = true;
				XA_PRINT("   Zero length edge: index %d position (%g %g %g), index %d position (%g %g %g)\n", index1, pos1.x, pos1.y, pos1.z, index2, pos2.x, pos2.y, pos2.z);
				break;
			}
		}
		// Ignore faces with any nan vertex attributes.
		if (!ignore) {
			for (int j = 0; j < 3; j++) {
				const internal::Vector3 &pos = mesh->position(tri[j]);
				if (internal::isNan(pos.x) || internal::isNan(pos.y) || internal::isNan(pos.z)) {
					XA_PRINT("   NAN position in face: %d\n", i);
					ignore = true;
					break;
				}
				if (meshDecl.vertexNormalData) {
					const internal::Vector3 &normal = mesh->normal(tri[j]);
					if (internal::isNan(normal.x) || internal::isNan(normal.y) || internal::isNan(normal.z)) {
						XA_PRINT("   NAN normal in face: %d\n", i);
						ignore = true;
						break;
					}
				}
				if (meshDecl.vertexUvData) {
					const internal::Vector2 &uv = mesh->texcoord(tri[j]);
					if (internal::isNan(uv.x) || internal::isNan(uv.y)) {
						XA_PRINT("   NAN texture coordinate in face: %d\n", i);
						ignore = true;
						break;
					}
				}
			}
		}
		const internal::Vector3 &a = mesh->position(tri[0]);
		const internal::Vector3 &b = mesh->position(tri[1]);
		const internal::Vector3 &c = mesh->position(tri[2]);
		// Check for zero area faces.
		float area = 0.0f;
		if (!ignore) {
			area = internal::length(internal::cross(b - a, c - a)) * 0.5f;
			if (area <= internal::kAreaEpsilon) {
				ignore = true;
				XA_PRINT("   Zero area face: %d, indices (%d %d %d), area is %f\n", i, tri[0], tri[1], tri[2], area);
			}
		}
		if (!ignore) {
			if (internal::equal(a, b, meshDecl.epsilon) || internal::equal(a, c, meshDecl.epsilon) || internal::equal(b, c, meshDecl.epsilon)) {
				ignore = true;
				XA_PRINT("   Degenerate face: %d, area is %f\n", i, area);
			}
		}
		if (meshDecl.faceIgnoreData && meshDecl.faceIgnoreData[i])
			ignore = true;
		mesh->addFace(tri[0], tri[1], tri[2], ignore);
	}
	XA_PROFILE_END(addMeshCopyData)
	if (ctx->addMeshTaskGroup.value == UINT32_MAX)
		ctx->addMeshTaskGroup = ctx->taskScheduler->createTaskGroup();
	AddMeshTaskArgs *taskArgs = XA_NEW(internal::MemTag::Default, AddMeshTaskArgs); // The task frees this.
	taskArgs->ctx = ctx;
	taskArgs->mesh = mesh;
	internal::Task task;
	task.userData = taskArgs;
	task.func = runAddMeshTask;
	ctx->taskScheduler->run(ctx->addMeshTaskGroup, task);
	ctx->meshCount++;
	return AddMeshError::Success;
}